

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O2

void __thiscall
iDynTree::MatrixDynSize::MatrixDynSize(MatrixDynSize *this,MatrixView<const_double> *other)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  double *pdVar5;
  size_t j;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  
  this->_vptr_MatrixDynSize = (_func_int **)&PTR__MatrixDynSize_00237c78;
  sVar1 = other->m_rows;
  this->m_rows = sVar1;
  sVar2 = other->m_cols;
  this->m_cols = sVar2;
  uVar4 = sVar2 * sVar1;
  if (uVar4 == 0) {
    this->m_capacity = 0;
    this->m_data = (double *)0x0;
  }
  else {
    this->m_capacity = uVar4;
    pdVar5 = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    this->m_data = pdVar5;
    for (sVar8 = 0; sVar8 != sVar1; sVar8 = sVar8 + 1) {
      for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
        sVar7 = sVar8;
        sVar3 = sVar6;
        if (other->m_storageOrder == RowMajor) {
          sVar7 = sVar6;
          sVar3 = sVar8;
        }
        pdVar5[sVar6] = other->m_storage[sVar3 * other->m_outerStride + sVar7];
      }
      pdVar5 = pdVar5 + sVar2;
    }
  }
  return;
}

Assistant:

MatrixDynSize::MatrixDynSize(MatrixView<const double> other) : m_rows(other.rows()),
                                                                      m_cols(other.cols())
{
    if( this->m_rows*this->m_cols == 0 )
    {
        this->m_capacity = 0;
        this->m_data = 0;
    }
    else
    {
        this->m_capacity = this->m_rows*this->m_cols;
        this->m_data = new double[this->m_capacity];

        // copy the matrix
        for(std::size_t i = 0; i < m_rows; i++)
        {
            for(std::size_t j = 0; j < m_cols; j++)
            {
                this->m_data[this->rawIndexRowMajor(i,j)] = other(i, j);
            }
        }
    }
}